

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockStrictOrderTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockStrictOrderTest_someOrderObserved_TestShell::createTest
          (TEST_MockStrictOrderTest_someOrderObserved_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockStrictOrderTest.cpp"
                                  ,0x33);
  TEST_MockStrictOrderTest_someOrderObserved_Test::TEST_MockStrictOrderTest_someOrderObserved_Test
            ((TEST_MockStrictOrderTest_someOrderObserved_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockStrictOrderTest, someOrderObserved)
{
    mock().expectOneCall("foo3").withCallOrder(3);
    mock().expectOneCall("foo1");
    mock().expectOneCall("foo2");
    mock().actualCall("foo2");
    mock().actualCall("foo1");
    mock().actualCall("foo3");

    mock().checkExpectations();
}